

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

parser<json_out_callbacks> * __thiscall
pstore::json::parser<json_out_callbacks>::
input<pstore::gsl::details::span_iterator<pstore::gsl::span<char_const,_1l>,false>>
          (parser<json_out_callbacks> *this,
          span_iterator<pstore::gsl::span<const_char,__1L>,_false> *first,
          span_iterator<pstore::gsl::span<const_char,__1L>,_false> *last)

{
  stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
  *this_00;
  matcher<json_out_callbacks> *pmVar1;
  reference ptVar2;
  size_type sVar3;
  error_category *peVar4;
  _Elt_pointer puVar5;
  pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
  res;
  char local_4a;
  type local_49;
  unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  local_48;
  char local_38;
  
  if ((this->error_)._M_value != 0) {
    return this;
  }
  this_00 = &this->stack_;
  do {
    if ((first->span_ == last->span_) && (first->index_ == last->index_)) {
      return this;
    }
    puVar5 = (this->stack_).c.
             super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar5 == (this->stack_).c.
                  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      assert_failed("!stack_.empty ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x716);
    }
    if (puVar5 == (this->stack_).c.
                  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar5 = (this->stack_).c.
               super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    pmVar1 = puVar5[-1]._M_t.
             super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
             .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
             _M_head_impl;
    ptVar2 = gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::operator*
                       (first);
    local_4a = '\x01';
    local_49 = *ptVar2;
    (*pmVar1->_vptr_matcher[2])(&local_48,pmVar1,this,&local_4a);
    if (local_4a == '\x01') {
      local_4a = '\0';
    }
    if ((puVar5[-1]._M_t.
         super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
         .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
        _M_head_impl)->state_ == 1) {
      if ((this->error_)._M_value != 0) goto LAB_0012e582;
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
      ::pop_back(&this_00->c);
    }
    if (local_48._M_t.
        super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
        _M_head_impl != (matcher<json_out_callbacks> *)0x0) {
      sVar3 = std::
              deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
              ::size(&this_00->c);
      if (200 < sVar3) {
        if ((this->error_)._M_value != 0) {
          assert_failed("!error_",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                        ,0x724);
        }
        peVar4 = get_error_category();
        (this->error_)._M_value = 0xe;
        (this->error_)._M_cat = peVar4;
LAB_0012e582:
        std::
        unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        ::~unique_ptr(&local_48);
        return this;
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>>
      ::
      emplace_back<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>
                ((deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>>
                  *)this_00,&local_48);
    }
    if (local_38 == '\x01') {
      gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::operator*(first);
      (this->coordinate_).column = (this->coordinate_).column + 1;
      gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::operator++(first);
    }
    std::
    unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ::~unique_ptr(&local_48);
  } while( true );
}

Assistant:

auto parser<Callbacks>::input (InputIterator first, InputIterator last) -> parser & {
            static_assert (
                std::is_same<typename std::remove_cv<
                                 typename std::iterator_traits<InputIterator>::value_type>::type,
                             char>::value,
                "iterator value_type must be char");
            if (error_) {
                return *this;
            }
            while (first != last) {
                PSTORE_ASSERT (!stack_.empty ());
                auto & handler = stack_.top ();
                auto res = handler->consume (*this, just (*first));
                if (handler->is_done ()) {
                    if (error_) {
                        break;
                    }
                    stack_.pop (); // release the topmost matcher object.
                }

                if (res.first != nullptr) {
                    if (stack_.size () > max_stack_depth_) {
                        // We've already hit the maximum allowed parse stack depth. Reject this new
                        // matcher.
                        PSTORE_ASSERT (!error_);
                        error_ = make_error_code (error_code::nesting_too_deep);
                        break;
                    }

                    stack_.push (std::move (res.first));
                }
                // If we're matching this character, advance the column number and increment the
                // iterator.
                if (res.second) {
                    // Increment the column number if this is _not_ a UTF-8 continuation character.
                    if (utf::is_utf_char_start (*first)) {
                        this->advance_column ();
                    }
                    ++first;
                }
            }
            return *this;
        }